

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCMP0018Flags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  string *flags_00;
  bool bVar1;
  TargetType targetType;
  TargetType TVar2;
  allocator<char> local_61;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_58 = config;
  targetType = cmGeneratorTarget::GetType(target);
  TVar2 = targetType & ~STATIC_LIBRARY;
  bVar1 = GetShouldUseOldFlags(this,TVar2 == SHARED_LIBRARY,lang);
  if (bVar1) {
    AddSharedFlags(this,flags,lang,TVar2 == SHARED_LIBRARY);
    return;
  }
  local_60 = flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"POSITION_INDEPENDENT_CODE",&local_61);
  bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty(target,&local_50,local_58);
  std::__cxx11::string::~string((string *)&local_50);
  flags_00 = local_60;
  if (bVar1) {
    AddPositionIndependentFlags(this,local_60,lang,targetType);
  }
  if (TVar2 == SHARED_LIBRARY) {
    AppendFeatureOptions(this,flags_00,lang,"DLL");
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCMP0018Flags(std::string& flags,
                                       cmGeneratorTarget const* target,
                                       std::string const& lang,
                                       const std::string& config)
{
  int targetType = target->GetType();

  bool shared = ((targetType == cmStateEnums::SHARED_LIBRARY) ||
                 (targetType == cmStateEnums::MODULE_LIBRARY));

  if (this->GetShouldUseOldFlags(shared, lang)) {
    this->AddSharedFlags(flags, lang, shared);
  } else {
    if (target->GetLinkInterfaceDependentBoolProperty(
          "POSITION_INDEPENDENT_CODE", config)) {
      this->AddPositionIndependentFlags(flags, lang, targetType);
    }
    if (shared) {
      this->AppendFeatureOptions(flags, lang, "DLL");
    }
  }
}